

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ant.cpp
# Opt level: O3

void __thiscall imrt::Ant::generateReference(Ant *this)

{
  _List_node_base *p_Var1;
  Station *this_00;
  Collimator *pCVar2;
  double v;
  long lVar3;
  int iVar4;
  int iVar5;
  pair<int,_int> p;
  mapped_type *this_01;
  long lVar6;
  difference_type __d;
  vector<int,_std::allocator<int>_> vaux;
  vector<int,_std::allocator<int>_> iaux;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  aux;
  key_type_conflict local_c0;
  int local_bc;
  vector<int,_std::allocator<int>_> local_b8;
  vector<int,_std::allocator<int>_> local_98;
  vector<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  *local_80;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_78;
  long local_70;
  long local_68;
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_60;
  
  if (0 < this->n_stations) {
    local_78 = &this->ref_intensity;
    local_80 = &this->ref_plan;
    local_70 = 0;
    local_68 = 0;
    do {
      local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_60._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_60._M_impl.super__Rb_tree_header._M_header;
      local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (int *)0x0;
      local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (int *)0x0;
      p_Var1 = (this->p->stations).
               super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl._M_node.
               super__List_node_base._M_next;
      lVar6 = local_70;
      lVar3 = local_68;
      while (lVar3 != 0) {
        p_Var1 = p_Var1->_M_next;
        lVar6 = lVar6 + 1;
        lVar3 = lVar6;
      }
      this_00 = (Station *)p_Var1[1]._M_next;
      local_c0 = 0;
      local_60._M_impl.super__Rb_tree_header._M_header._M_right =
           local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      if (0 < this->n_apertures) {
        do {
          pCVar2 = this->collimator;
          v = Station::getApertureIntensity(this_00,local_c0);
          iVar4 = Collimator::getIntensityLevel(pCVar2,v);
          local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)CONCAT44(local_b8.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,iVar4);
          if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish ==
              local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&local_98,
                       (iterator)
                       local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)&local_b8);
          }
          else {
            *local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish = iVar4;
            local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (int *)0x0;
          local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (int *)0x0;
          for (iVar4 = 0; iVar5 = Collimator::getXdim(this->collimator), iVar4 < iVar5;
              iVar4 = iVar4 + 1) {
            pCVar2 = this->collimator;
            p = Station::getApertureShape(this_00,local_c0,iVar4);
            local_bc = Collimator::searchReferenceIndex(pCVar2,p);
            if (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (&local_b8,
                         (iterator)
                         local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,&local_bc);
            }
            else {
              *local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = local_bc;
              local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish = local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
            }
          }
          this_01 = std::
                    map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                    ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                                  *)&local_60,&local_c0);
          std::vector<int,_std::allocator<int>_>::operator=(this_01,&local_b8);
          if (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          local_c0 = local_c0 + 1;
        } while (local_c0 < this->n_apertures);
      }
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::push_back(local_78,&local_98);
      lVar3 = local_68;
      std::
      vector<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
      ::push_back(local_80,(value_type *)&local_60);
      lVar6 = local_70;
      if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::~_Rb_tree(&local_60);
      local_68 = lVar3 + 1;
      local_70 = lVar6 + -1;
    } while (local_68 < this->n_stations);
  }
  return;
}

Assistant:

void Ant::generateReference() {
    Station * st;
    for (int s=0; s<n_stations; s++) {
      map <int, vector<int>> aux;
      vector <int> iaux;
      st = p->get_station(s);
      for (int a=0; a<n_apertures; a++) {
        // Set reference to intensity
        iaux.push_back(collimator.getIntensityLevel(st->getApertureIntensity(a)));
        
        // Set reference to aperture pattern
        vector <int> vaux;
        for (int i=0; i<collimator.getXdim(); i++) {
          vaux.push_back(collimator.searchReferenceIndex(st->getApertureShape(a,i)));
        }
        aux[a]=vaux;
      }
      ref_intensity.push_back(iaux);
      ref_plan.push_back(aux);
    }
    //printReferencePlan();
  }